

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::FixVariablePS::FixVariablePS
          (FixVariablePS *this,SPxLPBase<double> *lp,SPxMainSM<double> *simplifier,int _j,double val
          ,shared_ptr<soplex::Tolerances> *tols,bool correctIdx)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  double dVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  peVar3 = (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_38._M_pi =
       (tols->super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38._M_pi)->_M_use_count = (local_38._M_pi)->_M_use_count + 1;
    }
  }
  iVar1 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
  iVar2 = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_0069e680;
  (this->super_PostStep).m_name = "FixVariable";
  (this->super_PostStep).nCols = iVar2;
  (this->super_PostStep).nRows = iVar1;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &local_38);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FixVariablePS_0069eb98;
  this->m_j = _j;
  this->m_old_j = (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum + -1;
  this->m_val = val;
  this->m_obj = -(lp->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[_j];
  this->m_lower =
       (lp->super_LPColSetBase<double>).low.val.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start[_j];
  this->m_upper =
       (lp->super_LPColSetBase<double>).up.val.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_start[_j];
  this->m_correctIdx = correctIdx;
  DSVectorBase<double>::DSVectorBase<double>
            (&this->m_col,
             (SVectorBase<double> *)
             ((lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem +
             (lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[_j].idx));
  dVar4 = (lp->super_LPColSetBase<double>).object.val.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[this->m_j];
  if (lp->thesense == MINIMIZE) {
    dVar4 = -dVar4;
  }
  (*(simplifier->super_SPxSimplifier<double>)._vptr_SPxSimplifier[0x11])
            (dVar4 * this->m_val,simplifier);
  return;
}

Assistant:

FixVariablePS(const SPxLPBase<R>& lp, SPxMainSM& simplifier, int _j, const R val,
                    std::shared_ptr<Tolerances> tols, bool correctIdx = true)
         : PostStep("FixVariable", tols, lp.nRows(), lp.nCols())
         , m_j(_j)
         , m_old_j(lp.nCols() - 1)
         , m_val(val)
         , m_obj(lp.spxSense() == SPxLPBase<R>::MINIMIZE ? lp.obj(_j) : -lp.obj(_j))
         , m_lower(lp.lower(_j))
         , m_upper(lp.upper(_j))
         , m_correctIdx(correctIdx)
         , m_col(lp.colVector(_j))
      {
         simplifier.addObjoffset(m_val * lp.obj(m_j));
      }